

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O3

int check_matrix_entry(SUNMatrix A,realtype val,realtype tol)

{
  double dVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  lVar3 = SUNSparseMatrix_Data();
  lVar4 = SUNSparseMatrix_IndexPointers(A);
  lVar5 = SUNSparseMatrix_NP(A);
  lVar4 = *(long *)(lVar4 + lVar5 * 8);
  if (lVar4 < 1) {
    uVar2 = 0;
  }
  else {
    lVar5 = 0;
    iVar6 = 0;
    do {
      dVar1 = *(double *)(lVar3 + lVar5 * 8);
      if (NAN(dVar1)) {
        uVar2 = 1;
      }
      else {
        uVar2 = (uint)(tol < ABS((dVar1 - val) / val));
      }
      iVar6 = iVar6 + uVar2;
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
    uVar2 = (uint)(iVar6 != 0);
  }
  return uVar2;
}

Assistant:

int check_matrix_entry(SUNMatrix A, realtype val, realtype tol)
{
  int failure = 0;
  realtype *Adata;
  sunindextype *indexptrs;
  sunindextype i, NP;

  /* get data pointer */
  Adata = SUNSparseMatrix_Data(A);

  /* compare data */
  indexptrs = SUNSparseMatrix_IndexPointers(A);
  NP = SUNSparseMatrix_NP(A);
  for(i=0; i < indexptrs[NP]; i++){
    failure += FNEQ(Adata[i], val, tol);
  }

  if (failure > ZERO)
    return(1);
  else
    return(0);
}